

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffchfl(fitsfile *fptr,int *status)

{
  long bytepos;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  char *errmsg;
  int iVar5;
  char rec [81];
  long local_88;
  undefined1 local_80 [72];
  undefined1 local_38;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  bytepos = fptr->Fptr->headend;
  auVar1 = SEXT816(fptr->Fptr->datastart - bytepos) * SEXT816(0x6666666666666667);
  iVar5 = (int)(auVar1._8_8_ >> 5) - (auVar1._12_4_ >> 0x1f);
  ffmbyt(fptr,bytepos,1,status);
  if (0 < iVar5) {
    bVar2 = false;
    do {
      ffgbyt(fptr,0x50,&local_88,status);
      if (local_88 == 0x2020202020444e45) {
        if (bVar2) {
          *status = 0xfe;
          ffxmsg(5,"Warning: Header fill area contains duplicate END card:");
        }
        iVar3 = bcmp(local_80,
                     "                                                                        ",0x48
                    );
        iVar4 = 0xfd;
        errmsg = "Warning: END keyword contains extraneous non-blank characters:";
LAB_0014ef64:
        if (iVar3 != 0) {
          *status = iVar4;
          ffxmsg(5,errmsg);
        }
        bVar2 = true;
      }
      else {
        if (bVar2) {
          iVar3 = bcmp(&local_88,
                       "                                                                                "
                       ,0x50);
          iVar4 = 0xfe;
          errmsg = "Warning: Header fill area contains extraneous non-blank characters:";
          goto LAB_0014ef64;
        }
        bVar2 = false;
      }
      if (0 < *status) {
        local_38 = 0;
        ffxmsg(5,(char *)&local_88);
        break;
      }
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  return *status;
}

Assistant:

int ffchfl( fitsfile *fptr, int *status)
{
   int nblank,i,gotend;
   LONGLONG endpos;
   char rec[FLEN_CARD];
   char *blanks="                                                                                ";  /*  80 spaces  */

   if( *status > 0 ) return (*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

   /*   calculate the number of blank keyword slots in the header  */

   endpos=(fptr->Fptr)->headend;
   nblank=(long) (((fptr->Fptr)->datastart-endpos)/80);

   /*   move the i/o pointer to the end of the header keywords   */

   ffmbyt(fptr,endpos,TRUE,status);

   /*   find the END card (there may be blank keywords perceeding it)   */

   gotend=FALSE;
   for(i=0;i<nblank;i++) {
      ffgbyt(fptr,80,rec,status);
      if( !strncmp(rec, "END     ", 8) ) {
         if( gotend ) {
            /*   There is a duplicate END record   */
            *status=BAD_HEADER_FILL;
            ffpmsg("Warning: Header fill area contains duplicate END card:");
         }
         gotend=TRUE;
         if( strncmp( rec+8, blanks+8, 72) ) {
            /*   END keyword has extra characters   */
            *status=END_JUNK;
            ffpmsg(
            "Warning: END keyword contains extraneous non-blank characters:");
         }
      } else if( gotend ) {
         if( strncmp( rec, blanks, 80 ) ) {
            /*   The fill area contains extraneous characters   */
            *status=BAD_HEADER_FILL;
            ffpmsg(
         "Warning: Header fill area contains extraneous non-blank characters:");
         }
      }

      if( *status > 0 ) {
         rec[FLEN_CARD - 1] = '\0';  /* make sure string is null terminated */
         ffpmsg(rec);
         return( *status );
      }
   }
   return( *status );
}